

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

IVec2 (*) [4] glu::getDefaultGatherOffsets(void)

{
  int iVar1;
  
  if (getDefaultGatherOffsets()::s_defaultOffsets == '\0') {
    iVar1 = __cxa_guard_acquire(&getDefaultGatherOffsets()::s_defaultOffsets);
    if (iVar1 != 0) {
      tcu::Vector<int,_2>::Vector(getDefaultGatherOffsets::s_defaultOffsets,0,1);
      tcu::Vector<int,_2>::Vector(getDefaultGatherOffsets::s_defaultOffsets + 1,1,1);
      tcu::Vector<int,_2>::Vector(getDefaultGatherOffsets::s_defaultOffsets + 2,1,0);
      tcu::Vector<int,_2>::Vector(getDefaultGatherOffsets::s_defaultOffsets + 3,0,0);
      __cxa_guard_release(&getDefaultGatherOffsets()::s_defaultOffsets);
    }
  }
  return &getDefaultGatherOffsets::s_defaultOffsets;
}

Assistant:

const tcu::IVec2 (&getDefaultGatherOffsets (void))[4]
{
	static const tcu::IVec2 s_defaultOffsets[4] =
	{
		tcu::IVec2(0, 1),
		tcu::IVec2(1, 1),
		tcu::IVec2(1, 0),
		tcu::IVec2(0, 0),
	};
	return s_defaultOffsets;
}